

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_context.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::Context::Context
          (Context *this,FileDescriptor *file,Options *options)

{
  _Rb_tree_header *p_Var1;
  ClassNameResolver *this_00;
  
  this_00 = (ClassNameResolver *)operator_new(0x30);
  ClassNameResolver::ClassNameResolver(this_00);
  (this->name_resolver_).ptr_ = this_00;
  p_Var1 = &(this->field_generator_info_map_)._M_t._M_impl.super__Rb_tree_header;
  (this->field_generator_info_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->field_generator_info_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->field_generator_info_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->field_generator_info_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->field_generator_info_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->oneof_generator_info_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->oneof_generator_info_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  p_Var1 = &(this->oneof_generator_info_map_)._M_t._M_impl.super__Rb_tree_header;
  (this->oneof_generator_info_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->oneof_generator_info_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->oneof_generator_info_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  Options::Options(&this->options_,options);
  InitializeFieldGeneratorInfo(this,file);
  return;
}

Assistant:

Context::Context(const FileDescriptor* file, const Options& options)
    : name_resolver_(new ClassNameResolver), options_(options) {
  InitializeFieldGeneratorInfo(file);
}